

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_hoisted_temporaries
          (CompilerGLSL *this,
          SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
          *temporaries)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar4;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar5;
  mapped_type *pmVar6;
  SPIRType *type_00;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar7;
  bool local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [32];
  _Node_iterator_base<unsigned_int,_false> local_138;
  undefined1 local_130;
  uint32_t local_124;
  _Node_iterator_base<unsigned_int,_false> local_120;
  undefined1 local_118;
  uint32_t local_10c;
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  char *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  spirv_cross local_a0 [48];
  string local_70 [8];
  string initializer;
  SPIRType *type;
  Bitset *flags;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *tmp;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *__end1;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *__begin1;
  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
  *__range1;
  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
  *temporaries_local;
  CompilerGLSL *this_local;
  
  ppVar4 = ::std::
           begin<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                     (temporaries);
  ppVar5 = ::std::
           end<spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>>
                     (temporaries);
  ::std::
  sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>
            (ppVar4,ppVar5);
  __end1 = VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
           ::begin(&temporaries->
                    super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                  );
  ppVar4 = VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
           ::end(&temporaries->
                  super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
                );
  for (; __end1 != ppVar4; __end1 = __end1 + 1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
    add_local_variable_name(this,uVar2);
    pmVar6 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_Compiler).ir.meta,&__end1->second);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
    ::std::__cxx11::string::string(local_70);
    if ((((this->options).force_zero_initialized_variables & 1U) != 0) &&
       (bVar1 = type_can_zero_initialize(this,type_00), bVar1)) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      (*(this->super_Compiler)._vptr_Compiler[0x33])(local_c0,this,(ulong)uVar2);
      join<char_const(&)[4],std::__cxx11::string>(local_a0,(char (*) [4])0x4f38c2,local_c0);
      ::std::__cxx11::string::operator=(local_70,(string *)local_a0);
      ::std::__cxx11::string::~string((string *)local_a0);
      ::std::__cxx11::string::~string((string *)local_c0);
    }
    local_c8 = flags_to_qualifiers_glsl(this,type_00,&(pmVar6->decoration).decoration_flags);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
    (*(this->super_Compiler)._vptr_Compiler[6])(local_108,this,(ulong)uVar2,1);
    (*(this->super_Compiler)._vptr_Compiler[0x1a])(local_e8,this,type_00,local_108,0);
    statement<char_const*,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
              (this,&local_c8,local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               (char (*) [2])0x4d9ce2);
    ::std::__cxx11::string::~string((string *)local_e8);
    ::std::__cxx11::string::~string(local_108);
    local_10c = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
    pVar7 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert(&(this->super_Compiler).hoisted_temporaries,&local_10c);
    local_120._M_cur =
         (__node_type *)pVar7.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_118 = pVar7.second;
    local_124 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
    pVar7 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert(&(this->super_Compiler).forced_temporaries,&local_124);
    local_138._M_cur =
         (__node_type *)pVar7.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_130 = pVar7.second;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->second);
    (*(this->super_Compiler)._vptr_Compiler[6])(local_158,this,(ulong)uVar3,1);
    local_159 = true;
    Compiler::
    set<spirv_cross::SPIRExpression,std::__cxx11::string,spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
              (&this->super_Compiler,uVar2,local_158,&__end1->first,&local_159);
    ::std::__cxx11::string::~string((string *)local_158);
    ::std::__cxx11::string::~string(local_70);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_hoisted_temporaries(SmallVector<pair<TypeID, ID>> &temporaries)
{
	// If we need to force temporaries for certain IDs due to continue blocks, do it before starting loop header.
	// Need to sort these to ensure that reference output is stable.
	sort(begin(temporaries), end(temporaries),
	     [](const pair<TypeID, ID> &a, const pair<TypeID, ID> &b) { return a.second < b.second; });

	for (auto &tmp : temporaries)
	{
		add_local_variable_name(tmp.second);
		auto &flags = ir.meta[tmp.second].decoration.decoration_flags;
		auto &type = get<SPIRType>(tmp.first);

		// Not all targets support pointer literals, so don't bother with that case.
		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(tmp.first));

		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(tmp.second)), initializer, ";");

		hoisted_temporaries.insert(tmp.second);
		forced_temporaries.insert(tmp.second);

		// The temporary might be read from before it's assigned, set up the expression now.
		set<SPIRExpression>(tmp.second, to_name(tmp.second), tmp.first, true);
	}
}